

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeMetaData(D3MFExporter *this)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_468 [8];
  aiString value;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string k;
  size_t i;
  aiMetadataEntry *entry;
  aiString *key;
  D3MFExporter *pDStack_10;
  uint numMetaEntries;
  D3MFExporter *this_local;
  
  if ((this->mScene->mMetaData != (aiMetadata *)0x0) &&
     (key._4_4_ = this->mScene->mMetaData->mNumProperties, key._4_4_ != 0)) {
    entry = (aiMetadataEntry *)0x0;
    i = 0;
    pDStack_10 = this;
    for (k.field_2._8_8_ = 0; (ulong)k.field_2._8_8_ < (ulong)key._4_4_;
        k.field_2._8_8_ = k.field_2._8_8_ + 1) {
      aiMetadata::Get(this->mScene->mMetaData,k.field_2._8_8_,(aiString **)&entry,
                      (aiMetadataEntry **)&i);
      pcVar1 = aiString::C_Str((aiString *)entry);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar1,&local_51);
      std::allocator<char>::~allocator(&local_51);
      aiString::aiString((aiString *)local_468);
      aiMetadata::Get<aiString>(this->mScene->mMetaData,(string *)local_50,(aiString *)local_468);
      poVar2 = std::operator<<((ostream *)&this->mModelOutput,"<");
      poVar2 = std::operator<<(poVar2,(string *)XmlTag::meta_abi_cxx11_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,(string *)XmlTag::meta_name_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"=\"");
      pcVar1 = aiString::C_Str((aiString *)entry);
      poVar2 = std::operator<<(poVar2,pcVar1);
      std::operator<<(poVar2,"\">");
      pcVar1 = aiString::C_Str((aiString *)local_468);
      std::operator<<((ostream *)&this->mModelOutput,pcVar1);
      poVar2 = std::operator<<((ostream *)&this->mModelOutput,"</");
      poVar2 = std::operator<<(poVar2,(string *)XmlTag::meta_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,">");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void D3MFExporter::writeMetaData() {
    if ( nullptr == mScene->mMetaData ) {
        return;
    }

    const unsigned int numMetaEntries( mScene->mMetaData->mNumProperties );
    if ( 0 == numMetaEntries ) {
        return;
    }

	const aiString *key = nullptr;
    const aiMetadataEntry *entry(nullptr);
    for ( size_t i = 0; i < numMetaEntries; ++i ) {
        mScene->mMetaData->Get( i, key, entry );
        std::string k( key->C_Str() );
        aiString value;
        mScene->mMetaData->Get(  k, value );
        mModelOutput << "<" << XmlTag::meta << " " << XmlTag::meta_name << "=\"" << key->C_Str() << "\">";
        mModelOutput << value.C_Str();
        mModelOutput << "</" << XmlTag::meta << ">" << std::endl;
    }
}